

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

bool __thiscall sznet::net::EventLoop::hasChannel(EventLoop *this,Channel *channel)

{
  int iVar1;
  EventLoop *pEVar2;
  pointer pPVar3;
  Channel *channel_local;
  EventLoop *this_local;
  
  pEVar2 = Channel::ownerLoop(channel);
  if (pEVar2 == this) {
    assertInLoopThread(this);
    pPVar3 = std::unique_ptr<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>::
             operator->(&this->m_poller);
    iVar1 = (*pPVar3->_vptr_Poller[5])(pPVar3,channel);
    return (bool)((byte)iVar1 & 1);
  }
  __assert_fail("channel->ownerLoop() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                ,0xdb,"bool sznet::net::EventLoop::hasChannel(Channel *)");
}

Assistant:

bool EventLoop::hasChannel(Channel* channel)
{
	assert(channel->ownerLoop() == this);
	assertInLoopThread();
	return m_poller->hasChannel(channel);
}